

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 SySetRelease(SySet *pSet)

{
  if ((pSet->pAllocator != (SyMemBackend *)0x0) && (pSet->pBase != (void *)0x0)) {
    SyMemBackendFree(pSet->pAllocator,pSet->pBase);
  }
  pSet->pBase = (void *)0x0;
  pSet->nUsed = 0;
  pSet->nCursor = 0;
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 SySetRelease(SySet *pSet)
{
	sxi32 rc = SXRET_OK;
	if( pSet->pAllocator && pSet->pBase ){
		rc = SyMemBackendFree(pSet->pAllocator, pSet->pBase);
	}
	pSet->pBase = 0;
	pSet->nUsed = 0;
	pSet->nCursor = 0;
	return rc;
}